

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O1

void Curl_req_hard_reset(SingleRequest *req,Curl_easy *data)

{
  uint uVar1;
  
  (*Curl_cfree)((req->p).file);
  (req->p).file = (FILEPROTO *)0x0;
  (*Curl_cfree)(req->newurl);
  req->newurl = (char *)0x0;
  Curl_client_reset(data);
  if ((req->field_0xdb & 8) != 0) {
    Curl_bufq_reset(&req->sendbuf);
  }
  Curl_doh_close(data);
  *(undefined4 *)&req->size = 0xffffffff;
  *(undefined4 *)((long)&req->size + 4) = 0xffffffff;
  *(undefined4 *)&req->maxdownload = 0xffffffff;
  *(undefined4 *)((long)&req->maxdownload + 4) = 0xffffffff;
  req->upgr101 = UPGR101_INIT;
  req->setcookies = '\0';
  req->sendbuf_hds_len = 0;
  req->timeofdoc = 0;
  req->location = (char *)0x0;
  req->newurl = (char *)0x0;
  req->bytecount = 0;
  req->writebytecount = 0;
  (req->start).tv_sec = 0;
  (req->start).tv_usec = 0;
  *(undefined4 *)&(req->start).field_0xc = 0;
  req->headerbytecount = 0;
  req->allheadercount = 0;
  req->deductheadercount = 0;
  req->headerline = 0;
  req->offset = 0;
  req->httpcode = 0;
  req->keepon = 0;
  uVar1 = *(uint *)&req->field_0xd9;
  *(uint *)&req->field_0xd9 = uVar1 & 0xfffe2082;
  *(uint *)&req->field_0xd9 =
       uVar1 & 0xffe82082 | *(uint *)&(data->set).field_0x894 >> 0xc & 0x20000;
  return;
}

Assistant:

void Curl_req_hard_reset(struct SingleRequest *req, struct Curl_easy *data)
{
  struct curltime t0 = {0, 0};

  /* This is a bit ugly. `req->p` is a union and we assume we can
   * free this safely without leaks. */
  Curl_safefree(req->p.ftp);
  Curl_safefree(req->newurl);
  Curl_client_reset(data);
  if(req->sendbuf_init)
    Curl_bufq_reset(&req->sendbuf);

#ifndef CURL_DISABLE_DOH
  Curl_doh_close(data);
#endif
  /* Can no longer memset() this struct as we need to keep some state */
  req->size = -1;
  req->maxdownload = -1;
  req->bytecount = 0;
  req->writebytecount = 0;
  req->start = t0;
  req->headerbytecount = 0;
  req->allheadercount =  0;
  req->deductheadercount = 0;
  req->headerline = 0;
  req->offset = 0;
  req->httpcode = 0;
  req->keepon = 0;
  req->upgr101 = UPGR101_INIT;
  req->sendbuf_hds_len = 0;
  req->timeofdoc = 0;
  req->location = NULL;
  req->newurl = NULL;
#ifndef CURL_DISABLE_COOKIES
  req->setcookies = 0;
#endif
  req->header = FALSE;
  req->content_range = FALSE;
  req->download_done = FALSE;
  req->eos_written = FALSE;
  req->eos_read = FALSE;
  req->eos_sent = FALSE;
  req->upload_done = FALSE;
  req->upload_aborted = FALSE;
  req->ignorebody = FALSE;
  req->http_bodyless = FALSE;
  req->chunk = FALSE;
  req->ignore_cl = FALSE;
  req->upload_chunky = FALSE;
  req->getheader = FALSE;
  req->no_body = data->set.opt_no_body;
  req->authneg = FALSE;
  req->shutdown = FALSE;
}